

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArray.h
# Opt level: O3

void __thiscall
pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
pushBack<pica::Particle<(pica::Dimension)3>>
          (ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *this,
          Particle<(pica::Dimension)3> particle)

{
  iterator iVar1;
  iterator __position;
  int d;
  long lVar2;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *pPVar3;
  double local_70;
  double local_68 [4];
  double local_48 [4];
  
  local_48[2] = particle.position.z;
  local_48[0] = particle.position.x;
  local_48[1] = particle.position.y;
  lVar2 = 0;
  pPVar3 = this;
  do {
    local_68[0] = local_48[lVar2];
    iVar1._M_current = *(double **)(pPVar3 + 8);
    if (iVar1._M_current == *(double **)(pPVar3 + 0x10)) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                ((vector<double,_std::allocator<double>_> *)pPVar3,iVar1,local_68);
    }
    else {
      *iVar1._M_current = local_48[lVar2];
      *(double **)(pPVar3 + 8) = iVar1._M_current + 1;
    }
    lVar2 = lVar2 + 1;
    pPVar3 = pPVar3 + 0x18;
  } while (lVar2 != 3);
  local_68[2] = particle.p.z;
  local_68[0] = particle.p.x;
  local_68[1] = particle.p.y;
  pPVar3 = this + 0x48;
  lVar2 = 0;
  do {
    local_70 = local_68[lVar2];
    iVar1._M_current = *(double **)(pPVar3 + 8);
    if (iVar1._M_current == *(double **)(pPVar3 + 0x10)) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                ((vector<double,_std::allocator<double>_> *)pPVar3,iVar1,&local_70);
    }
    else {
      *iVar1._M_current = local_70;
      *(double **)(pPVar3 + 8) = iVar1._M_current + 1;
    }
    lVar2 = lVar2 + 1;
    pPVar3 = pPVar3 + 0x18;
  } while (lVar2 != 3);
  local_70 = particle.factor;
  iVar1._M_current = *(double **)(this + 0x98);
  if (iVar1._M_current == *(double **)(this + 0xa0)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)(this + 0x90),iVar1,&local_70);
  }
  else {
    *iVar1._M_current = particle.factor;
    *(double **)(this + 0x98) = iVar1._M_current + 1;
  }
  local_70 = 1.0 / (1.0 / particle.invGamma);
  iVar1._M_current = *(double **)(this + 0xb0);
  if (iVar1._M_current == *(double **)(this + 0xb8)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)(this + 0xa8),iVar1,&local_70);
  }
  else {
    *iVar1._M_current = local_70;
    *(double **)(this + 0xb0) = iVar1._M_current + 1;
  }
  local_70 = (double)CONCAT62(local_70._2_6_,particle.typeIndex);
  __position._M_current = *(short **)(this + 200);
  if (__position._M_current == *(short **)(this + 0xd0)) {
    std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
              ((vector<short,_std::allocator<short>_> *)(this + 0xc0),__position,(short *)&local_70)
    ;
  }
  else {
    *__position._M_current = particle.typeIndex;
    *(short **)(this + 200) = __position._M_current + 1;
  }
  return;
}

Assistant:

void pushBack(ConstParticleRefType particle)
    {
        const typename ParticleRef::PositionType position = particle.getPosition();
        for (int d = 0; d < ParticleRef::dimension; d++)
            positions[d].push_back(position[d]);
        const typename ParticleRef::MomentumType p = particle.getP();
        for (int d = 0; d < ParticleRef::momentumDimension; d++)
            ps[d].push_back(p[d]);
        factors.push_back(particle.getFactor());
        invGammas.push_back(static_cast<typename ParticleRef::GammaType>(1.0) / particle.getGamma());
        typeIndex.push_back(particle.getType());
    }